

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiTextFilter::ImGuiTextFilter(ImGuiTextFilter *this,char *default_filter)

{
  ImGuiTextFilter *in_RSI;
  undefined1 *in_RDI;
  ImVector<ImGuiTextFilter::ImGuiTextRange> *this_00;
  char *in_stack_ffffffffffffffc8;
  
  this_00 = (ImVector<ImGuiTextFilter::ImGuiTextRange> *)(in_RDI + 0x100);
  ImVector<ImGuiTextFilter::ImGuiTextRange>::ImVector(this_00);
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 0x110) = 0;
  if (in_RSI != (ImGuiTextFilter *)0x0) {
    ImStrncpy((char *)this_00,in_stack_ffffffffffffffc8,0x49c417);
    Build(in_RSI);
  }
  return;
}

Assistant:

ImGuiTextFilter::ImGuiTextFilter(const char* default_filter) //-V1077
{
    InputBuf[0] = 0;
    CountGrep = 0;
    if (default_filter)
    {
        ImStrncpy(InputBuf, default_filter, IM_ARRAYSIZE(InputBuf));
        Build();
    }
}